

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaStr.c
# Opt level: O0

void Str_ManNormalize_rec
               (Str_Ntk_t *pNtk,Gia_Man_t *p,Gia_Obj_t *pObj,Vec_Wec_t *vGroups,Vec_Int_t *vRoots)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  Gia_Obj_t *pGVar6;
  Vec_Int_t *pVVar7;
  Str_Obj_t *pSVar8;
  int *pFanins_00;
  bool bVar9;
  Gia_Obj_t *pTemp;
  int t_1;
  int t;
  int pFanins [3];
  Gia_Obj_t *pMux;
  Gia_Obj_t *pRoot;
  Vec_Int_t *vGroup;
  int iEnd;
  int iBeg;
  int iLit;
  int iVar;
  int k;
  int i;
  Vec_Int_t *vRoots_local;
  Vec_Wec_t *vGroups_local;
  Gia_Obj_t *pObj_local;
  Gia_Man_t *p_local;
  Str_Ntk_t *pNtk_local;
  
  if (pObj->Value == 0xffffffff) {
    pObj->Value = 0;
    iVar1 = Gia_ObjIsAnd(pObj);
    if (iVar1 == 0) {
      __assert_fail("Gia_ObjIsAnd(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaStr.c"
                    ,0x285,
                    "void Str_ManNormalize_rec(Str_Ntk_t *, Gia_Man_t *, Gia_Obj_t *, Vec_Wec_t *, Vec_Int_t *)"
                   );
    }
    iVar1 = Gia_ObjIsMux(p,pObj);
    if (iVar1 == 0) {
      Gia_ManSuperCollect(p,pObj);
      iVar1 = Vec_IntSize(p->vStore);
      Vec_IntAppend(p->vStore,p->vSuper);
      iVar4 = Vec_IntSize(p->vStore);
      for (iVar = iVar1; iVar < iVar4; iVar = iVar + 1) {
        iVar3 = Vec_IntEntry(p->vStore,iVar);
        iVar5 = Abc_Lit2Var(iVar3);
        pGVar6 = Gia_ManObj(p,iVar5);
        Str_ManNormalize_rec(pNtk,p,pGVar6,vGroups,vRoots);
        pVVar7 = p->vStore;
        uVar2 = pGVar6->Value;
        iVar3 = Abc_LitIsCompl(iVar3);
        iVar3 = Abc_LitNotCond(uVar2,iVar3);
        Vec_IntWriteEntry(pVVar7,iVar,iVar3);
      }
      iVar3 = Vec_IntSize(p->vStore);
      if (iVar3 != iVar4) {
        __assert_fail("Vec_IntSize(p->vStore) == iEnd",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaStr.c"
                      ,0x2d3,
                      "void Str_ManNormalize_rec(Str_Ntk_t *, Gia_Man_t *, Gia_Obj_t *, Vec_Wec_t *, Vec_Int_t *)"
                     );
      }
      iVar3 = Gia_ObjIsXor(pObj);
      iVar5 = 3;
      if (iVar3 != 0) {
        iVar5 = 4;
      }
      pFanins_00 = Vec_IntEntryP(p->vStore,iVar1);
      uVar2 = Str_ObjCreate(pNtk,iVar5,iVar4 - iVar1,pFanins_00);
      pObj->Value = uVar2;
      Vec_IntShrink(p->vStore,iVar1);
    }
    else {
      iVar1 = Gia_ObjId(p,pObj);
      iVar1 = Vec_IntEntry(vRoots,iVar1);
      if (iVar1 == -1) {
        pGVar6 = Gia_ObjFanin0(pObj);
        Str_ManNormalize_rec(pNtk,p,pGVar6,vGroups,vRoots);
        pGVar6 = Gia_ObjFanin1(pObj);
        Str_ManNormalize_rec(pNtk,p,pGVar6,vGroups,vRoots);
        pGVar6 = Gia_ObjFanin2(p,pObj);
        Str_ManNormalize_rec(pNtk,p,pGVar6,vGroups,vRoots);
        t_1 = Gia_ObjFanin0Copy(pObj);
        t = Gia_ObjFanin1Copy(pObj);
        pFanins[0] = Gia_ObjFanin2Copy(p,pObj);
        iVar1 = Abc_LitIsCompl(pFanins[0]);
        if (iVar1 != 0) {
          pFanins[0] = Abc_LitNot(pFanins[0]);
          iVar1 = t_1;
          t_1 = t;
          t = iVar1;
        }
        uVar2 = Str_ObjCreate(pNtk,5,3,&t_1);
        pObj->Value = uVar2;
      }
      else {
        iVar1 = Gia_ObjId(p,pObj);
        iVar1 = Vec_IntEntry(vRoots,iVar1);
        pVVar7 = Vec_WecEntry(vGroups,iVar1);
        iVar = 0;
        while( true ) {
          iVar1 = Vec_IntSize(pVVar7);
          bVar9 = false;
          if (iVar < iVar1) {
            iVar1 = Vec_IntEntry(pVVar7,iVar);
            pMux = Gia_ManObj(p,iVar1);
            bVar9 = pMux != (Gia_Obj_t *)0x0;
          }
          if (!bVar9) break;
          Str_MuxInputsCollect(p,pMux,p->vSuper);
          iVar1 = Vec_IntSize(p->vStore);
          Vec_IntAppend(p->vStore,p->vSuper);
          iVar4 = Vec_IntSize(p->vStore);
          for (iLit = iVar1; iLit < iVar4; iLit = iLit + 1) {
            iVar3 = Vec_IntEntry(p->vStore,iLit);
            pGVar6 = Gia_ManObj(p,iVar3);
            Str_ManNormalize_rec(pNtk,p,pGVar6,vGroups,vRoots);
          }
          Vec_IntShrink(p->vStore,iVar1);
          iVar = iVar + 1;
        }
        iVar = 0;
        while( true ) {
          iVar1 = Vec_IntSize(pVVar7);
          bVar9 = false;
          if (iVar < iVar1) {
            iVar1 = Vec_IntEntry(pVVar7,iVar);
            pMux = Gia_ManObj(p,iVar1);
            bVar9 = pMux != (Gia_Obj_t *)0x0;
          }
          if (!bVar9) break;
          Str_MuxStructCollect(p,pMux,p->vSuper);
          iLit = 0;
          while( true ) {
            iVar1 = Vec_IntSize(p->vSuper);
            bVar9 = false;
            if (iLit < iVar1) {
              iVar1 = Vec_IntEntry(p->vSuper,iLit);
              pFanins._4_8_ = Gia_ManObj(p,iVar1);
              bVar9 = (Gia_Obj_t *)pFanins._4_8_ != (Gia_Obj_t *)0x0;
            }
            if (!bVar9) break;
            t_1 = Gia_ObjFanin0Copy((Gia_Obj_t *)pFanins._4_8_);
            t = Gia_ObjFanin1Copy((Gia_Obj_t *)pFanins._4_8_);
            pFanins[0] = Gia_ObjFanin2Copy(p,(Gia_Obj_t *)pFanins._4_8_);
            iVar1 = Abc_LitIsCompl(pFanins[0]);
            if (iVar1 != 0) {
              pFanins[0] = Abc_LitNot(pFanins[0]);
              iVar1 = t_1;
              t_1 = t;
              t = iVar1;
            }
            iVar1 = Str_ObjCreate(pNtk,5,3,&t_1);
            *(int *)(pFanins._4_8_ + 8) = iVar1;
            iLit = iLit + 1;
          }
          if (pMux->Value == 0xffffffff) {
            __assert_fail("~pRoot->Value",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaStr.c"
                          ,0x2b7,
                          "void Str_ManNormalize_rec(Str_Ntk_t *, Gia_Man_t *, Gia_Obj_t *, Vec_Wec_t *, Vec_Int_t *)"
                         );
          }
          iLit = 0;
          while( true ) {
            iVar1 = Vec_IntSize(p->vSuper);
            bVar9 = false;
            if (iLit < iVar1) {
              iVar1 = Vec_IntEntry(p->vSuper,iLit);
              pFanins._4_8_ = Gia_ManObj(p,iVar1);
              bVar9 = (Gia_Obj_t *)pFanins._4_8_ != (Gia_Obj_t *)0x0;
            }
            if (!bVar9) break;
            iVar1 = Abc_Lit2Var(pMux->Value);
            iVar4 = Abc_Lit2Var(*(int *)(pFanins._4_8_ + 8));
            pSVar8 = Str_NtkObj(pNtk,iVar4);
            pSVar8->iTop = iVar1;
            iLit = iLit + 1;
          }
          pNtk->nTrees = pNtk->nTrees + 1;
          iVar = iVar + 1;
        }
        if (pObj->Value == 0xffffffff) {
          __assert_fail("~pObj->Value",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaStr.c"
                        ,0x2bd,
                        "void Str_ManNormalize_rec(Str_Ntk_t *, Gia_Man_t *, Gia_Obj_t *, Vec_Wec_t *, Vec_Int_t *)"
                       );
        }
        iVar1 = Vec_IntEntryLast(pVVar7);
        pGVar6 = Gia_ManObj(p,iVar1);
        iVar = 0;
        while( true ) {
          iVar1 = Vec_IntSize(pVVar7);
          bVar9 = false;
          if (iVar < iVar1) {
            iVar1 = Vec_IntEntry(pVVar7,iVar);
            pMux = Gia_ManObj(p,iVar1);
            bVar9 = pMux != (Gia_Obj_t *)0x0;
          }
          if (!bVar9) break;
          iVar1 = Abc_Lit2Var(pGVar6->Value);
          iVar4 = Abc_Lit2Var(pMux->Value);
          pSVar8 = Str_NtkObj(pNtk,iVar4);
          pSVar8->iTop = iVar1;
          iVar = iVar + 1;
        }
        pNtk->nGroups = pNtk->nGroups + 1;
      }
    }
  }
  return;
}

Assistant:

void Str_ManNormalize_rec( Str_Ntk_t * pNtk, Gia_Man_t * p, Gia_Obj_t * pObj, Vec_Wec_t * vGroups, Vec_Int_t * vRoots )
{
    int i, k, iVar, iLit, iBeg, iEnd;
    if ( ~pObj->Value )
        return;
    pObj->Value = 0;
    assert( Gia_ObjIsAnd(pObj) );
    if ( Gia_ObjIsMux(p, pObj) )
    {
        Vec_Int_t * vGroup;
        Gia_Obj_t * pRoot, * pMux;
        int pFanins[3];
        if ( Vec_IntEntry(vRoots, Gia_ObjId(p, pObj)) == -1 )
        {
            Str_ManNormalize_rec( pNtk, p, Gia_ObjFanin0(pObj), vGroups, vRoots );
            Str_ManNormalize_rec( pNtk, p, Gia_ObjFanin1(pObj), vGroups, vRoots );
            Str_ManNormalize_rec( pNtk, p, Gia_ObjFanin2(p, pObj), vGroups, vRoots );
            pFanins[0] = Gia_ObjFanin0Copy(pObj);
            pFanins[1] = Gia_ObjFanin1Copy(pObj);
            pFanins[2] = Gia_ObjFanin2Copy(p, pObj);
            if ( Abc_LitIsCompl(pFanins[2]) )
            {
                pFanins[2] = Abc_LitNot(pFanins[2]);
                ABC_SWAP( int, pFanins[0], pFanins[1] );
            }
            pObj->Value = Str_ObjCreate( pNtk, STR_MUX, 3, pFanins );
            return;
        }
        vGroup = Vec_WecEntry( vGroups, Vec_IntEntry(vRoots, Gia_ObjId(p, pObj)) );
        // build data-inputs for each tree
        Gia_ManForEachObjVec( vGroup, p, pRoot, i )
        {
            Str_MuxInputsCollect( p, pRoot, p->vSuper );
            iBeg = Vec_IntSize( p->vStore );
            Vec_IntAppend( p->vStore, p->vSuper );
            iEnd = Vec_IntSize( p->vStore );
            Vec_IntForEachEntryStartStop( p->vStore, iVar, k, iBeg, iEnd )
                Str_ManNormalize_rec( pNtk, p, Gia_ManObj(p, iVar), vGroups, vRoots );
            Vec_IntShrink( p->vStore, iBeg );
        }
        // build internal structures
        Gia_ManForEachObjVec( vGroup, p, pRoot, i )
        {
            Str_MuxStructCollect( p, pRoot, p->vSuper );
            Gia_ManForEachObjVec( p->vSuper, p, pMux, k )
            {
                pFanins[0] = Gia_ObjFanin0Copy(pMux);
                pFanins[1] = Gia_ObjFanin1Copy(pMux);
                pFanins[2] = Gia_ObjFanin2Copy(p, pMux);
                if ( Abc_LitIsCompl(pFanins[2]) )
                {
                    pFanins[2] = Abc_LitNot(pFanins[2]);
                    ABC_SWAP( int, pFanins[0], pFanins[1] );
                }
                pMux->Value = Str_ObjCreate( pNtk, STR_MUX, 3, pFanins );
            }
            assert( ~pRoot->Value );
            // set mapping
            Gia_ManForEachObjVec( p->vSuper, p, pMux, k )
                Str_NtkObj(pNtk, Abc_Lit2Var(pMux->Value))->iTop = Abc_Lit2Var(pRoot->Value);
            pNtk->nTrees++;
        }
        assert( ~pObj->Value );
        // set mapping
        pObj = Gia_ManObj( p, Vec_IntEntryLast(vGroup) );
        Gia_ManForEachObjVec( vGroup, p, pRoot, i )
            Str_NtkObj(pNtk, Abc_Lit2Var(pRoot->Value))->iTop = Abc_Lit2Var(pObj->Value);
        pNtk->nGroups++;
        //printf( "%d x %d  ", Vec_IntSize(vGroup), Vec_IntSize(p->vSuper) );
        return;
    }
    // find supergate
    Gia_ManSuperCollect( p, pObj );
    // save entries
    iBeg = Vec_IntSize( p->vStore );
    Vec_IntAppend( p->vStore, p->vSuper );
    iEnd = Vec_IntSize( p->vStore );
    // call recursively
    Vec_IntForEachEntryStartStop( p->vStore, iLit, i, iBeg, iEnd )
    {
        Gia_Obj_t * pTemp = Gia_ManObj( p, Abc_Lit2Var(iLit) );
        Str_ManNormalize_rec( pNtk, p, pTemp, vGroups, vRoots );
        Vec_IntWriteEntry( p->vStore, i, Abc_LitNotCond(pTemp->Value, Abc_LitIsCompl(iLit)) );
    }
    assert( Vec_IntSize(p->vStore) == iEnd );
    // consider general case
    pObj->Value = Str_ObjCreate( pNtk, Gia_ObjIsXor(pObj) ? STR_XOR : STR_AND, iEnd-iBeg, Vec_IntEntryP(p->vStore, iBeg) );
    Vec_IntShrink( p->vStore, iBeg );
}